

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL3_glfw::GLFrameBuffer::GLFrameBuffer
          (GLFrameBuffer *this,uint sizeX_,uint sizeY_,bool isDefault)

{
  byte in_CL;
  uint in_EDX;
  uint in_ESI;
  FrameBuffer *in_RDI;
  bool in_stack_00000087;
  
  FrameBuffer::FrameBuffer(in_RDI);
  in_RDI->_vptr_FrameBuffer = (_func_int **)&PTR__GLFrameBuffer_00796060;
  in_RDI->sizeX = in_ESI;
  in_RDI->sizeY = in_EDX;
  if ((in_CL & 1) == 0) {
    (*glad_glGenFramebuffers)(1,(GLuint *)(in_RDI + 1));
    (*glad_glBindFramebuffer)(0x8d40,*(GLuint *)&in_RDI[1]._vptr_FrameBuffer);
  }
  else {
    *(undefined4 *)&in_RDI[1]._vptr_FrameBuffer = 0;
  }
  checkGLError(in_stack_00000087);
  return;
}

Assistant:

GLFrameBuffer::GLFrameBuffer(unsigned int sizeX_, unsigned int sizeY_, bool isDefault) {
  sizeX = sizeX_;
  sizeY = sizeY_;
  if (isDefault) {
    handle = 0;
  } else {
    glGenFramebuffers(1, &handle);
    glBindFramebuffer(GL_FRAMEBUFFER, handle);
  }
  checkGLError();
}